

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O3

void Fraig_OrderVariables(Fraig_Man_t *pMan,Fraig_Node_t *pOld,Fraig_Node_t *pNew)

{
  int iVar1;
  int iVar2;
  Fraig_Node_t *pFVar3;
  Fraig_Node_t *pFVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Fraig_NodeVec_t *pFVar9;
  Fraig_Node_t *pFVar10;
  Msat_IntVec_t *pMVar11;
  uint Entry;
  ulong uVar12;
  int i;
  long lVar13;
  uint Entry_00;
  uint Entry_01;
  int *piVar14;
  Fraig_Node_t *pNodeT;
  Fraig_Node_t *local_40;
  Fraig_Node_t *local_38;
  
  if (pOld == pNew) {
    __assert_fail("pOld != pNew",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                  ,0x371,"void Fraig_OrderVariables(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *)")
    ;
  }
  if (((ulong)pOld & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pOld)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                  ,0x372,"void Fraig_OrderVariables(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *)")
    ;
  }
  if (((ulong)pNew & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                  ,0x373,"void Fraig_OrderVariables(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *)")
    ;
  }
  pMan->nTravIds = pMan->nTravIds + 1;
  iVar5 = Msat_IntVecReadSize(pMan->vVarsUsed);
  i = 0;
  Msat_IntVecFill(pMan->vVarsUsed,iVar5,0);
  Msat_IntVecClear(pMan->vVarsInt);
  Msat_IntVecPush(pMan->vVarsInt,pOld->Num);
  Msat_IntVecWriteEntry(pMan->vVarsUsed,pOld->Num,1);
  pOld->TravId = pMan->nTravIds;
  Msat_IntVecPush(pMan->vVarsInt,pNew->Num);
  Msat_IntVecWriteEntry(pMan->vVarsUsed,pNew->Num,1);
  pNew->TravId = pMan->nTravIds;
  iVar5 = Msat_IntVecReadSize(pMan->vVarsInt);
  if (0 < iVar5) {
    do {
      iVar5 = Msat_IntVecReadEntry(pMan->vVarsInt,i);
      pFVar3 = pMan->vNodes->pArray[iVar5];
      iVar5 = Fraig_NodeIsAnd(pFVar3);
      if (iVar5 != 0) {
        pFVar9 = pFVar3->vFanins;
        if (pFVar9 == (Fraig_NodeVec_t *)0x0) {
          if ((pFVar3->field_0x18 & 4) != 0) {
            __assert_fail("pNode->fClauses == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                          ,0x393,
                          "void Fraig_OrderVariables(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *)"
                         );
          }
          iVar5 = Fraig_NodeIsMuxType(pFVar3);
          if (iVar5 == 0) {
            pFVar9 = Fraig_CollectSupergate(pFVar3,1);
            pFVar3->vFanins = pFVar9;
            iVar5 = Fraig_NodeIsAnd(pFVar3);
            if (iVar5 == 0) {
              __assert_fail("Fraig_NodeIsAnd( pNode )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                            ,0x454,
                            "void Fraig_SupergateAddClauses(Fraig_Man_t *, Fraig_Node_t *, Fraig_NodeVec_t *)"
                           );
            }
            iVar6 = Msat_SolverReadVarNum(pMan->pSat);
            iVar5 = pFVar3->Num;
            if (iVar6 <= iVar5) {
              __assert_fail("Var < nVars",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                            ,0x458,
                            "void Fraig_SupergateAddClauses(Fraig_Man_t *, Fraig_Node_t *, Fraig_NodeVec_t *)"
                           );
            }
            if (0 < pFVar9->nSize) {
              lVar13 = 0;
              do {
                pFVar4 = pFVar9->pArray[lVar13];
                iVar7 = *(int *)((ulong)pFVar4 & 0xfffffffffffffffe);
                if (iVar6 <= iVar7) {
                  __assert_fail("Var1 < nVars",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                                ,0x461,
                                "void Fraig_SupergateAddClauses(Fraig_Man_t *, Fraig_Node_t *, Fraig_NodeVec_t *)"
                               );
                }
                Msat_IntVecClear(pMan->vProj);
                Msat_IntVecPush(pMan->vProj,((uint)pFVar4 & 1) + iVar7 * 2);
                Msat_IntVecPush(pMan->vProj,iVar5 * 2 + 1);
                iVar7 = Msat_SolverAddClause(pMan->pSat,pMan->vProj);
                if (iVar7 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                                ,0x46a,
                                "void Fraig_SupergateAddClauses(Fraig_Man_t *, Fraig_Node_t *, Fraig_NodeVec_t *)"
                               );
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 < pFVar9->nSize);
            }
            Msat_IntVecClear(pMan->vProj);
            if (0 < pFVar9->nSize) {
              lVar13 = 0;
              do {
                Msat_IntVecPush(pMan->vProj,
                                ((uint)pFVar9->pArray[lVar13] & 1) +
                                *(int *)((ulong)pFVar9->pArray[lVar13] & 0xfffffffffffffffe) * 2 ^ 1
                               );
                lVar13 = lVar13 + 1;
              } while (lVar13 < pFVar9->nSize);
            }
            Msat_IntVecPush(pMan->vProj,iVar5 * 2);
            iVar5 = Msat_SolverAddClause(pMan->pSat,pMan->vProj);
            if (iVar5 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                            ,0x47d,
                            "void Fraig_SupergateAddClauses(Fraig_Man_t *, Fraig_Node_t *, Fraig_NodeVec_t *)"
                           );
            }
          }
          else {
            pFVar9 = Fraig_NodeVecAlloc(4);
            pFVar3->vFanins = pFVar9;
            Fraig_NodeVecPushUnique
                      (pFVar9,(Fraig_Node_t *)
                              (*(ulong *)(((ulong)pFVar3->p1 & 0xfffffffffffffffe) + 0x20) &
                              0xfffffffffffffffe));
            Fraig_NodeVecPushUnique
                      (pFVar3->vFanins,
                       (Fraig_Node_t *)
                       (*(ulong *)(((ulong)pFVar3->p1 & 0xfffffffffffffffe) + 0x28) &
                       0xfffffffffffffffe));
            Fraig_NodeVecPushUnique
                      (pFVar3->vFanins,
                       (Fraig_Node_t *)
                       (*(ulong *)(((ulong)pFVar3->p2 & 0xfffffffffffffffe) + 0x20) &
                       0xfffffffffffffffe));
            Fraig_NodeVecPushUnique
                      (pFVar3->vFanins,
                       (Fraig_Node_t *)
                       (*(ulong *)(((ulong)pFVar3->p2 & 0xfffffffffffffffe) + 0x28) &
                       0xfffffffffffffffe));
            if (((ulong)pFVar3 & 1) != 0) {
              __assert_fail("!Fraig_IsComplement( pNode )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                            ,0x4c3,
                            "void Fraig_SupergateAddClausesMux(Fraig_Man_t *, Fraig_Node_t *)");
            }
            iVar5 = Fraig_NodeIsMuxType(pFVar3);
            if (iVar5 == 0) {
              __assert_fail("Fraig_NodeIsMuxType( pNode )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                            ,0x4c4,
                            "void Fraig_SupergateAddClausesMux(Fraig_Man_t *, Fraig_Node_t *)");
            }
            pFVar10 = Fraig_NodeRecognizeMux(pFVar3,&local_38,&local_40);
            pFVar4 = local_40;
            iVar6 = pFVar3->Num;
            iVar7 = pFVar10->Num;
            iVar1 = *(int *)((ulong)local_38 & 0xfffffffffffffffe);
            iVar2 = *(int *)((ulong)local_40 & 0xfffffffffffffffe);
            uVar8 = (uint)local_38;
            Msat_IntVecClear(pMan->vProj);
            iVar5 = iVar7 * 2 + 1;
            Msat_IntVecPush(pMan->vProj,iVar5);
            Entry_00 = (uVar8 & 1) + iVar1 * 2;
            Msat_IntVecPush(pMan->vProj,Entry_00 ^ 1);
            uVar8 = iVar6 * 2;
            Msat_IntVecPush(pMan->vProj,uVar8);
            iVar6 = Msat_SolverAddClause(pMan->pSat,pMan->vProj);
            if (iVar6 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                            ,0x4dd,
                            "void Fraig_SupergateAddClausesMux(Fraig_Man_t *, Fraig_Node_t *)");
            }
            Msat_IntVecClear(pMan->vProj);
            Msat_IntVecPush(pMan->vProj,iVar5);
            Msat_IntVecPush(pMan->vProj,Entry_00);
            Entry = uVar8 | 1;
            Msat_IntVecPush(pMan->vProj,Entry);
            iVar5 = Msat_SolverAddClause(pMan->pSat,pMan->vProj);
            if (iVar5 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                            ,0x4e3,
                            "void Fraig_SupergateAddClausesMux(Fraig_Man_t *, Fraig_Node_t *)");
            }
            iVar7 = iVar7 * 2;
            Msat_IntVecClear(pMan->vProj);
            Msat_IntVecPush(pMan->vProj,iVar7);
            Entry_01 = ((uint)pFVar4 & 1) + iVar2 * 2;
            Msat_IntVecPush(pMan->vProj,Entry_01 ^ 1);
            Msat_IntVecPush(pMan->vProj,uVar8);
            iVar5 = Msat_SolverAddClause(pMan->pSat,pMan->vProj);
            if (iVar5 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                            ,0x4e9,
                            "void Fraig_SupergateAddClausesMux(Fraig_Man_t *, Fraig_Node_t *)");
            }
            Msat_IntVecClear(pMan->vProj);
            Msat_IntVecPush(pMan->vProj,iVar7);
            Msat_IntVecPush(pMan->vProj,Entry_01);
            Msat_IntVecPush(pMan->vProj,Entry);
            iVar5 = Msat_SolverAddClause(pMan->pSat,pMan->vProj);
            if (iVar5 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                            ,0x4ef,
                            "void Fraig_SupergateAddClausesMux(Fraig_Man_t *, Fraig_Node_t *)");
            }
            if (iVar1 != iVar2) {
              Msat_IntVecClear(pMan->vProj);
              Msat_IntVecPush(pMan->vProj,Entry_00);
              Msat_IntVecPush(pMan->vProj,Entry_01);
              Msat_IntVecPush(pMan->vProj,Entry);
              iVar5 = Msat_SolverAddClause(pMan->pSat,pMan->vProj);
              if (iVar5 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                              ,0x503,
                              "void Fraig_SupergateAddClausesMux(Fraig_Man_t *, Fraig_Node_t *)");
              }
              Msat_IntVecClear(pMan->vProj);
              Msat_IntVecPush(pMan->vProj,Entry_00 ^ 1);
              Msat_IntVecPush(pMan->vProj,Entry_01 ^ 1);
              Msat_IntVecPush(pMan->vProj,uVar8);
              iVar5 = Msat_SolverAddClause(pMan->pSat,pMan->vProj);
              if (iVar5 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                              ,0x509,
                              "void Fraig_SupergateAddClausesMux(Fraig_Man_t *, Fraig_Node_t *)");
              }
            }
            nMuxes = nMuxes + 1;
          }
          pFVar9 = pFVar3->vFanins;
          if (pFVar9->nSize < 2) {
            __assert_fail("pNode->vFanins->nSize > 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                          ,0x3a8,
                          "void Fraig_OrderVariables(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *)"
                         );
          }
          pFVar3->field_0x18 = pFVar3->field_0x18 | 4;
          pMan->nVarsClauses = pMan->nVarsClauses + 1;
          pFVar3->field_0x18 = pFVar3->field_0x18 | 0x20;
        }
        if (0 < pFVar9->nSize) {
          iVar5 = pMan->nTravIds;
          lVar13 = 0;
          do {
            piVar14 = (int *)((ulong)pFVar9->pArray[lVar13] & 0xfffffffffffffffe);
            if (piVar14[4] != iVar5) {
              Msat_IntVecPush(pMan->vVarsInt,*piVar14);
              Msat_IntVecWriteEntry(pMan->vVarsUsed,*piVar14,1);
              iVar5 = pMan->nTravIds;
              piVar14[4] = iVar5;
              pFVar9 = pFVar3->vFanins;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 < pFVar9->nSize);
        }
      }
      i = i + 1;
      iVar5 = Msat_IntVecReadSize(pMan->vVarsInt);
    } while (i < iVar5);
  }
  pMVar11 = pMan->vVarsInt;
  uVar8 = Msat_IntVecReadSize(pMVar11);
  piVar14 = Msat_IntVecReadArray(pMVar11);
  if (0 < (int)uVar8) {
    uVar12 = 0;
    do {
      pFVar3 = pMan->vNodes->pArray[piVar14[uVar12]];
      if ((pFVar3->field_0x18 & 0x20) != 0) {
        iVar5 = Fraig_NodeIsAnd(pFVar3);
        if (iVar5 != 0) {
          pMVar11 = (Msat_IntVec_t *)Msat_ClauseVecReadEntry(pMan->vAdjacents,piVar14[uVar12]);
          pFVar9 = pFVar3->vFanins;
          if (0 < pFVar9->nSize) {
            lVar13 = 0;
            do {
              Msat_IntVecPush(pMVar11,*(int *)((ulong)pFVar9->pArray[lVar13] & 0xfffffffffffffffe));
              lVar13 = lVar13 + 1;
              pFVar9 = pFVar3->vFanins;
            } while (lVar13 < pFVar9->nSize);
          }
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar8);
    uVar12 = 0;
    do {
      pFVar3 = pMan->vNodes->pArray[piVar14[uVar12]];
      if ((*(uint *)&pFVar3->field_0x18 & 0x20) != 0) {
        *(uint *)&pFVar3->field_0x18 = *(uint *)&pFVar3->field_0x18 & 0xffffffdf;
        iVar5 = Fraig_NodeIsAnd(pFVar3);
        if ((iVar5 != 0) && (pFVar9 = pFVar3->vFanins, 0 < pFVar9->nSize)) {
          lVar13 = 0;
          do {
            pMVar11 = (Msat_IntVec_t *)
                      Msat_ClauseVecReadEntry
                                (pMan->vAdjacents,
                                 *(int *)((ulong)pFVar9->pArray[lVar13] & 0xfffffffffffffffe));
            Msat_IntVecPush(pMVar11,pFVar3->Num);
            lVar13 = lVar13 + 1;
            pFVar9 = pFVar3->vFanins;
          } while (lVar13 < pFVar9->nSize);
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar8);
  }
  return;
}

Assistant:

void Fraig_OrderVariables( Fraig_Man_t * pMan, Fraig_Node_t * pOld, Fraig_Node_t * pNew )
{
    Fraig_Node_t * pNode, * pFanin;
    int i, k, Number, fUseMuxes = 1;
    int nVarsAlloc;

    assert( pOld != pNew );
    assert( !Fraig_IsComplement(pOld) );
    assert( !Fraig_IsComplement(pNew) );

    pMan->nTravIds++;

    // clean the variables
    nVarsAlloc = Msat_IntVecReadSize(pMan->vVarsUsed);
    Msat_IntVecFill( pMan->vVarsUsed, nVarsAlloc, 0 );
    Msat_IntVecClear( pMan->vVarsInt );

    // add the first node
    Msat_IntVecPush( pMan->vVarsInt, pOld->Num );
    Msat_IntVecWriteEntry( pMan->vVarsUsed, pOld->Num, 1 );
    pOld->TravId = pMan->nTravIds;

    // add the second node
    Msat_IntVecPush( pMan->vVarsInt, pNew->Num );
    Msat_IntVecWriteEntry( pMan->vVarsUsed, pNew->Num, 1 );
    pNew->TravId = pMan->nTravIds;

    // create the variable order
    for ( i = 0; i < Msat_IntVecReadSize(pMan->vVarsInt); i++ )
    {
        // get the new node on the frontier
        Number = Msat_IntVecReadEntry(pMan->vVarsInt, i);
        pNode = pMan->vNodes->pArray[Number];
        if ( !Fraig_NodeIsAnd(pNode) )
            continue;

        // if the node does not have fanins, create them
        if ( pNode->vFanins == NULL )
        {
            // create the fanins of the supergate
            assert( pNode->fClauses == 0 );
            // detecting a fanout-free cone (experiment only)
//            Fraig_DetectFanoutFreeCone( pMan, pNode );

            if ( fUseMuxes && Fraig_NodeIsMuxType(pNode) )
            {
                pNode->vFanins = Fraig_NodeVecAlloc( 4 );
                Fraig_NodeVecPushUnique( pNode->vFanins, Fraig_Regular(Fraig_Regular(pNode->p1)->p1) );
                Fraig_NodeVecPushUnique( pNode->vFanins, Fraig_Regular(Fraig_Regular(pNode->p1)->p2) );
                Fraig_NodeVecPushUnique( pNode->vFanins, Fraig_Regular(Fraig_Regular(pNode->p2)->p1) );
                Fraig_NodeVecPushUnique( pNode->vFanins, Fraig_Regular(Fraig_Regular(pNode->p2)->p2) );
                Fraig_SupergateAddClausesMux( pMan, pNode );
//                Fraig_DetectFanoutFreeConeMux( pMan, pNode );

                nMuxes++;
            }
            else
            {
                pNode->vFanins = Fraig_CollectSupergate( pNode, fUseMuxes );
                Fraig_SupergateAddClauses( pMan, pNode, pNode->vFanins );
            }
            assert( pNode->vFanins->nSize > 1 );
            pNode->fClauses = 1;
            pMan->nVarsClauses++;

            pNode->fMark2 = 1; // goes together with Fraig_SetupAdjacentMark()
        }

        // explore the implication fanins of pNode
        for ( k = 0; k < pNode->vFanins->nSize; k++ )
        {
            pFanin = Fraig_Regular(pNode->vFanins->pArray[k]);
            if ( pFanin->TravId == pMan->nTravIds ) // already collected
                continue;
            // collect and mark
            Msat_IntVecPush( pMan->vVarsInt, pFanin->Num );
            Msat_IntVecWriteEntry( pMan->vVarsUsed, pFanin->Num, 1 );
            pFanin->TravId = pMan->nTravIds;
        }
    }

    // set up the adjacent variable information
//    Fraig_SetupAdjacent( pMan, pMan->vVarsInt );
    Fraig_SetupAdjacentMark( pMan, pMan->vVarsInt );
}